

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O0

char * stripRegisterPrefix(char *RegName)

{
  int iVar1;
  char *RegName_local;
  char *local_8;
  
  iVar1 = (int)*RegName;
  local_8 = RegName;
  if (iVar1 == 99) {
    if (RegName[1] == 'r') {
      local_8 = RegName + 2;
    }
  }
  else if (((iVar1 == 0x66) || (iVar1 - 0x71U < 2)) || (iVar1 == 0x76)) {
    if (RegName[1] == 's') {
      local_8 = RegName + 2;
    }
    else {
      local_8 = RegName + 1;
    }
  }
  return local_8;
}

Assistant:

static const char *stripRegisterPrefix(const char *RegName)
{
	switch (RegName[0]) {
		case 'r':
		case 'f':
		case 'q': // for QPX
		case 'v':
			if (RegName[1] == 's')
				return RegName + 2;
			return RegName + 1;
		case 'c':
			if (RegName[1] == 'r')
				return RegName + 2;
	}

	return RegName;
}